

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ImplicitEventControlSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplicitEventControlSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,Token *args_3)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  TokenKind TVar17;
  undefined1 uVar18;
  NumericTokenFlags NVar19;
  uint32_t uVar20;
  ImplicitEventControlSyntax *pIVar21;
  
  pIVar21 = (ImplicitEventControlSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ImplicitEventControlSyntax *)this->endPtr < pIVar21 + 1) {
    pIVar21 = (ImplicitEventControlSyntax *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(pIVar21 + 1);
  }
  TVar5 = args->kind;
  uVar6 = args->field_0x2;
  NVar7.raw = (args->numFlags).raw;
  uVar8 = args->rawLen;
  pIVar1 = args->info;
  TVar9 = args_1->kind;
  uVar10 = args_1->field_0x2;
  NVar11.raw = (args_1->numFlags).raw;
  uVar12 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar13 = args_2->kind;
  uVar14 = args_2->field_0x2;
  NVar15.raw = (args_2->numFlags).raw;
  uVar16 = args_2->rawLen;
  pIVar3 = args_2->info;
  TVar17 = args_3->kind;
  uVar18 = args_3->field_0x2;
  NVar19.raw = (args_3->numFlags).raw;
  uVar20 = args_3->rawLen;
  pIVar4 = args_3->info;
  (pIVar21->super_TimingControlSyntax).super_SyntaxNode.kind = ImplicitEventControl;
  (pIVar21->super_TimingControlSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pIVar21->super_TimingControlSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pIVar21->at).kind = TVar5;
  (pIVar21->at).field_0x2 = uVar6;
  (pIVar21->at).numFlags = (NumericTokenFlags)NVar7.raw;
  (pIVar21->at).rawLen = uVar8;
  (pIVar21->at).info = pIVar1;
  (pIVar21->openParen).kind = TVar9;
  (pIVar21->openParen).field_0x2 = uVar10;
  (pIVar21->openParen).numFlags = (NumericTokenFlags)NVar11.raw;
  (pIVar21->openParen).rawLen = uVar12;
  (pIVar21->openParen).info = pIVar2;
  (pIVar21->star).kind = TVar13;
  (pIVar21->star).field_0x2 = uVar14;
  (pIVar21->star).numFlags = (NumericTokenFlags)NVar15.raw;
  (pIVar21->star).rawLen = uVar16;
  (pIVar21->star).info = pIVar3;
  (pIVar21->closeParen).kind = TVar17;
  (pIVar21->closeParen).field_0x2 = uVar18;
  (pIVar21->closeParen).numFlags = (NumericTokenFlags)NVar19.raw;
  (pIVar21->closeParen).rawLen = uVar20;
  (pIVar21->closeParen).info = pIVar4;
  return pIVar21;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }